

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O2

apx_error_t apx_vm_deserializer_create(apx_vm_deserializer_t *self)

{
  apx_error_t aVar1;
  apx_vm_readState_t *paVar2;
  
  if (self != (apx_vm_deserializer_t *)0x0) {
    adt_stack_create(&self->stack,state_vdelete);
    paVar2 = state_new();
    self->state = paVar2;
    if (paVar2 == (apx_vm_readState_t *)0x0) {
      aVar1 = 2;
    }
    else {
      (self->queued_read_state).max_length = 0;
      (self->queued_read_state).current_length = 0;
      (self->queued_read_state).element_size = 0;
      (self->queued_read_state).index = 0;
      (self->buffer).next = (uint8_t *)0x0;
      (self->buffer).padded_next = (uint8_t *)0x0;
      (self->buffer).begin = (uint8_t *)0x0;
      (self->buffer).end = (uint8_t *)0x0;
      (self->queued_read_state).size_type = '\0';
      (self->queued_read_state).is_active = false;
      aVar1 = 0;
    }
    return aVar1;
  }
  return 1;
}

Assistant:

apx_error_t apx_vm_deserializer_create(apx_vm_deserializer_t* self)
{
   if (self != NULL)
   {
      adt_stack_create(&self->stack, state_vdelete);
      self->state = state_new();
      if (self->state == NULL)
      {
         return APX_MEM_ERROR;
      }
      read_buffer_init(&self->buffer);
      queued_read_state_init(&self->queued_read_state);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}